

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

void ctype_prepstr(CTRepr *ctr,char *str,MSize len)

{
  char *pcVar1;
  uint uVar2;
  char *local_28;
  char *p;
  MSize len_local;
  char *str_local;
  CTRepr *ctr_local;
  
  pcVar1 = ctr->pb;
  if (pcVar1 < ctr->buf + (ulong)len + 1) {
    ctr->ok = 0;
  }
  else {
    local_28 = pcVar1;
    if (ctr->needsp != 0) {
      local_28 = pcVar1 + -1;
      pcVar1[-1] = ' ';
    }
    ctr->needsp = 1;
    p._4_4_ = len;
    while (uVar2 = p._4_4_ - 1, p._4_4_ != 0) {
      (local_28 + -(ulong)len)[uVar2] = str[uVar2];
      p._4_4_ = uVar2;
    }
    ctr->pb = local_28 + -(ulong)len;
  }
  return;
}

Assistant:

static void ctype_prepstr(CTRepr *ctr, const char *str, MSize len)
{
  char *p = ctr->pb;
  if (ctr->buf + len+1 > p) { ctr->ok = 0; return; }
  if (ctr->needsp) *--p = ' ';
  ctr->needsp = 1;
  p -= len;
  while (len-- > 0) p[len] = str[len];
  ctr->pb = p;
}